

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O2

wchar_t file_close(archive *a,void *client_data)

{
  close(*client_data);
  archive_mstring_clean((archive_mstring *)((long)client_data + 8));
  free(client_data);
  return L'\0';
}

Assistant:

static int
file_close(struct archive *a, void *client_data)
{
	struct write_file_data	*mine = (struct write_file_data *)client_data;

	(void)a; /* UNUSED */
	close(mine->fd);
	archive_mstring_clean(&mine->filename);
	free(mine);
	return (ARCHIVE_OK);
}